

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

void Abc_NtkPermutePiUsingFanout(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  
  qsort(pNtk->vPis->pArray,(long)pNtk->vPis->nSize,8,Abc_NodeCompareByFanoutCount);
  pNtk->vCis->nSize = 0;
  pVVar3 = pNtk->vPis;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar3->pArray[lVar6];
      pVVar3 = pNtk->vCis;
      uVar1 = pVVar3->nCap;
      if (pVVar3->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar1 * 2;
          if (iVar5 <= (int)uVar1) goto LAB_001e9015;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
          }
          pVVar3->pArray = ppvVar4;
        }
        pVVar3->nCap = iVar5;
      }
LAB_001e9015:
      iVar5 = pVVar3->nSize;
      pVVar3->nSize = iVar5 + 1;
      pVVar3->pArray[iVar5] = pvVar2;
      lVar6 = lVar6 + 1;
      pVVar3 = pNtk->vPis;
    } while (lVar6 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkPermutePiUsingFanout( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode; int i;
    qsort( (void *)Vec_PtrArray(pNtk->vPis), Vec_PtrSize(pNtk->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareByFanoutCount );
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vPis, pNode, i )
        Vec_PtrPush( pNtk->vCis, pNode );
}